

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O0

void __thiscall cmXMLElement::cmXMLElement(cmXMLElement *this,cmXMLElement *par,char *tag)

{
  cmXMLWriter *this_00;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *tag_local;
  cmXMLElement *par_local;
  cmXMLElement *this_local;
  
  this->xmlwr = par->xmlwr;
  this_00 = this->xmlwr;
  local_20 = tag;
  tag_local = (char *)par;
  par_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,tag,&local_41);
  cmXMLWriter::StartElement(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

cmXMLElement(cmXMLElement& par, const char* tag)
    : xmlwr(par.xmlwr)
  {
    this->xmlwr.StartElement(tag);
  }